

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_client.cc
# Opt level: O1

void __thiscall
common::SSH2Client::SSH2Client
          (SSH2Client *this,string *user,string *password,string *ip,uint16_t port,string *alias)

{
  pointer pcVar1;
  
  (this->m_user)._M_dataplus._M_p = (pointer)&(this->m_user).field_2;
  pcVar1 = (user->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + user->_M_string_length);
  (this->m_password)._M_dataplus._M_p = (pointer)&(this->m_password).field_2;
  pcVar1 = (password->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_password,pcVar1,pcVar1 + password->_M_string_length);
  (this->m_ip)._M_dataplus._M_p = (pointer)&(this->m_ip).field_2;
  pcVar1 = (ip->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_ip,pcVar1,pcVar1 + ip->_M_string_length);
  this->m_port = port;
  (this->m_alias)._M_dataplus._M_p = (pointer)&(this->m_alias).field_2;
  pcVar1 = (alias->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_alias,pcVar1,pcVar1 + alias->_M_string_length);
  this->session = (LIBSSH2_SESSION *)0x0;
  this->channel = (LIBSSH2_CHANNEL *)0x0;
  return;
}

Assistant:

SSH2Client::SSH2Client(std::string user, std::string password,
    std::string ip, uint16_t port, std::string alias) :
    m_user(user), m_password(password), m_ip(ip), m_port(port), m_alias(alias) {
}